

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

bool __thiscall
glslang::TReflection::addStage(TReflection *this,EShLanguage stage,TIntermediate *intermediate)

{
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  TIntermNode *pTVar4;
  undefined4 extraout_var;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar5;
  reference ppTVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar7;
  long lVar8;
  TQualifier *pTVar9;
  undefined4 extraout_var_04;
  TIntermSymbol *pNode;
  TIntermNode **sequnence_1;
  iterator __end4;
  iterator __begin4;
  TIntermSequence *__range4;
  TIntermAggregate *linkerObjects;
  TIntermNode **sequnence;
  iterator __end1;
  iterator __begin1;
  TIntermSequence *__range1;
  TReflectionTraverser it;
  TIntermediate *intermediate_local;
  EShLanguage stage_local;
  TReflection *this_local;
  undefined4 extraout_var_03;
  
  it._120_8_ = intermediate;
  pTVar4 = TIntermediate::getTreeRoot(intermediate);
  if (((pTVar4 == (TIntermNode *)0x0) ||
      (iVar2 = TIntermediate::getNumEntryPoints((TIntermediate *)it._120_8_), iVar2 != 1)) ||
     (bVar1 = TIntermediate::isRecursive((TIntermediate *)it._120_8_), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    buildAttributeReflection(this,stage,(TIntermediate *)it._120_8_);
    TReflectionTraverser::TReflectionTraverser
              ((TReflectionTraverser *)&__range1,(TIntermediate *)it._120_8_,this);
    pTVar4 = TIntermediate::getTreeRoot((TIntermediate *)it._120_8_);
    iVar2 = (*pTVar4->_vptr_TIntermNode[6])();
    pvVar5 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))();
    __end1 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(pvVar5);
    sequnence = (TIntermNode **)
                std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                       *)&sequnence), bVar1) {
      ppTVar6 = __gnu_cxx::
                __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&__end1);
      iVar2 = (*(*ppTVar6)->_vptr_TIntermNode[6])();
      if (CONCAT44(extraout_var_00,iVar2) != 0) {
        iVar2 = (*(*ppTVar6)->_vptr_TIntermNode[6])();
        TVar3 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_01,iVar2));
        if (TVar3 == EOpLinkerObjects) {
          it.processedDerefs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
          iVar2 = (*(*ppTVar6)->_vptr_TIntermNode[6])();
          pvVar5 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 400))();
          __end4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                             (pvVar5);
          sequnence_1 = (TIntermNode **)
                        std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                                  (pvVar5);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                             *)&sequnence_1), bVar1) {
            ppTVar6 = __gnu_cxx::
                      __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                      ::operator*(&__end4);
            iVar2 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
            plVar7 = (long *)CONCAT44(extraout_var_03,iVar2);
            if (plVar7 != (long *)0x0) {
              lVar8 = (**(code **)(*plVar7 + 0x108))();
              if (((((uint)*(undefined8 *)(lVar8 + 8) & 0x7f) == 5) &&
                  ((this->options & EShReflectionSharedStd140UBO) != EShReflectionDefault)) ||
                 ((lVar8 = (**(code **)(*plVar7 + 0x108))(),
                  ((uint)*(undefined8 *)(lVar8 + 8) & 0x7f) == 6 &&
                  ((this->options & EShReflectionSharedStd140SSBO) != EShReflectionDefault)))) {
                iVar2 = (**(code **)(*plVar7 + 0x100))();
                if ((iVar2 == 0x10) &&
                   ((lVar8 = (**(code **)(*plVar7 + 0x108))(), (*(byte *)(lVar8 + 0x10) & 0xf) == 2
                    || (lVar8 = (**(code **)(*plVar7 + 0x108))(),
                       (*(byte *)(lVar8 + 0x10) & 0xf) == 1)))) {
                  (**(code **)(*plVar7 + 0x10))(plVar7,&__range1);
                }
              }
              else if ((this->options & EShReflectionAllIOVariables) != EShReflectionDefault) {
                pTVar9 = (TQualifier *)(**(code **)(*plVar7 + 0x108))();
                bVar1 = TQualifier::isPipeInput(pTVar9);
                if (!bVar1) {
                  pTVar9 = (TQualifier *)(**(code **)(*plVar7 + 0x108))();
                  bVar1 = TQualifier::isPipeOutput(pTVar9);
                  if (!bVar1) goto LAB_00616c3c;
                }
                (**(code **)(*plVar7 + 0x10))(plVar7,&__range1);
              }
            }
LAB_00616c3c:
            __gnu_cxx::
            __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
            ::operator++(&__end4);
          }
        }
        else {
          it.processedDerefs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
          iVar2 = (*(*ppTVar6)->_vptr_TIntermNode[6])();
          (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x10))
                    ((long *)CONCAT44(extraout_var_04,iVar2),&__range1);
        }
      }
      __gnu_cxx::
      __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
      ::operator++(&__end1);
    }
    it.processedDerefs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
    buildCounterIndices(this,(TIntermediate *)it._120_8_);
    buildUniformStageMask(this,(TIntermediate *)it._120_8_);
    this_local._7_1_ = true;
    TReflectionTraverser::~TReflectionTraverser((TReflectionTraverser *)&__range1);
  }
  return this_local._7_1_;
}

Assistant:

bool TReflection::addStage(EShLanguage stage, const TIntermediate& intermediate)
{
    if (intermediate.getTreeRoot() == nullptr ||
        intermediate.getNumEntryPoints() != 1 ||
        intermediate.isRecursive())
        return false;

    buildAttributeReflection(stage, intermediate);

    TReflectionTraverser it(intermediate, *this);

    for (auto& sequnence : intermediate.getTreeRoot()->getAsAggregate()->getSequence()) {
        if (sequnence->getAsAggregate() != nullptr) {
            if (sequnence->getAsAggregate()->getOp() == glslang::EOpLinkerObjects) {
                it.updateStageMasks = false;
                TIntermAggregate* linkerObjects = sequnence->getAsAggregate();
                for (auto& sequnence : linkerObjects->getSequence()) {
                    auto pNode = sequnence->getAsSymbolNode();
                    if (pNode != nullptr) {
                        if ((pNode->getQualifier().storage == EvqUniform &&
                            (options & EShReflectionSharedStd140UBO)) ||
                           (pNode->getQualifier().storage == EvqBuffer &&
                            (options & EShReflectionSharedStd140SSBO))) {
                            // collect std140 and shared uniform block form AST
                            if ((pNode->getBasicType() == EbtBlock) &&
                                ((pNode->getQualifier().layoutPacking == ElpStd140) ||
                                 (pNode->getQualifier().layoutPacking == ElpShared))) {
                                   pNode->traverse(&it);
                            }
                        }
                        else if ((options & EShReflectionAllIOVariables) &&
                            (pNode->getQualifier().isPipeInput() || pNode->getQualifier().isPipeOutput()))
                        {
                            pNode->traverse(&it);
                        }
                    }
                }
            } else {
                // This traverser will travers all function in AST.
                // If we want reflect uncalled function, we need set linke message EShMsgKeepUncalled.
                // When EShMsgKeepUncalled been set to true, all function will be keep in AST, even it is a uncalled function.
                // This will keep some uniform variables in reflection, if those uniform variables is used in these uncalled function.
                //
                // If we just want reflect only live node, we can use a default link message or set EShMsgKeepUncalled false.
                // When linke message not been set EShMsgKeepUncalled, linker won't keep uncalled function in AST.
                // So, travers all function node can equivalent to travers live function.
                it.updateStageMasks = true;
                sequnence->getAsAggregate()->traverse(&it);
            }
        }
    }
    it.updateStageMasks = true;

    buildCounterIndices(intermediate);
    buildUniformStageMask(intermediate);

    return true;
}